

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O1

void __thiscall
cmFileMonitor::MonitorPaths
          (cmFileMonitor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,Callback *cb)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>_>
  *this_00;
  cmRootWatcher *p;
  bool bVar1;
  ulong uVar2;
  iterator iVar3;
  long lVar4;
  cmRealDirectoryWatcher *this_01;
  cmVirtualDirectoryWatcher *p_00;
  cmRealDirectoryWatcher *pcVar5;
  cmRootWatcher *pcVar6;
  string *p_01;
  key_type *__k;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathSegments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string *local_68;
  string *local_60;
  ulong local_58;
  _Any_data local_50;
  code *local_40;
  
  p_01 = (paths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (p_01 != local_68) {
    do {
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmsys::SystemTools::SplitPath(p_01,&local_88,true);
      local_60 = p_01;
      bVar1 = cmsys::SystemTools::FileIsDirectory(p_01);
      uVar2 = (long)local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (1 < uVar2) {
        pcVar6 = this->Root;
        local_58 = uVar2 - 1;
        lVar7 = 0;
        uVar8 = 0;
        do {
          if (pcVar6 == (cmRootWatcher *)0x0) {
            __assert_fail("currentWatcher",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                          ,0x140,
                          "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                         );
          }
          bVar9 = local_58 == uVar8;
          if ((uVar8 == 0) && (bVar9 && !bVar1)) {
            __assert_fail("!(fileSegment && rootSegment)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                          ,0x146,
                          "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                         );
          }
          if (*(long *)((long)&(local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar7
                       ) != 0) {
            __k = (key_type *)
                  ((long)&((local_88.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7);
            this_00 = &(pcVar6->super_cmVirtualDirectoryWatcher).Children;
            iVar3 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&this_00->_M_h,__k);
            if (iVar3.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                ._M_cur == (__node_type *)0x0) {
              this_01 = (cmRealDirectoryWatcher *)0x0;
            }
            else {
              this_01 = *(cmRealDirectoryWatcher **)
                         ((long)iVar3.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                                ._M_cur + 0x28);
            }
            if (this_01 == (cmRealDirectoryWatcher *)0x0) {
              if (uVar8 == 0) {
                p = this->Root;
                if (pcVar6 != p) {
                  __assert_fail("currentWatcher == this->Root",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                                ,0x150,
                                "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                               );
                }
                this_01 = (cmRealDirectoryWatcher *)operator_new(0x70);
                cmRealDirectoryWatcher::cmRealDirectoryWatcher
                          (this_01,&p->super_cmVirtualDirectoryWatcher,__k);
                (this_01->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher
                     = (_func_int **)&PTR__cmRealDirectoryWatcher_00605968;
                iVar3 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&this_00->_M_h,__k);
                if (iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  pcVar5 = (cmRealDirectoryWatcher *)0x0;
                }
                else {
                  pcVar5 = *(cmRealDirectoryWatcher **)
                            ((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                                   ._M_cur + 0x28);
                }
                if (pcVar5 != this_01) {
                  __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                                ,0x152,
                                "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                               );
                }
              }
              else if (bVar9 && !bVar1) {
                if (pcVar6 == this->Root) {
                  __assert_fail("currentWatcher != this->Root",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                                ,0x154,
                                "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                               );
                }
                this_01 = (cmRealDirectoryWatcher *)operator_new(0x48);
                pcVar5 = (cmRealDirectoryWatcher *)
                         __dynamic_cast(pcVar6,&cmVirtualDirectoryWatcher::typeinfo,
                                        &cmRealDirectoryWatcher::typeinfo,0);
                std::
                function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
                ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
                            *)&local_50,cb);
                cmFileWatcher::cmFileWatcher
                          ((cmFileWatcher *)this_01,pcVar5,__k,(Callback *)&local_50);
                if (local_40 != (code *)0x0) {
                  (*local_40)(&local_50,&local_50,__destroy_functor);
                }
                iVar3 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&this_00->_M_h,__k);
                if (iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  pcVar5 = (cmRealDirectoryWatcher *)0x0;
                }
                else {
                  pcVar5 = *(cmRealDirectoryWatcher **)
                            ((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                                   ._M_cur + 0x28);
                }
                if (pcVar5 != this_01) {
                  __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                                ,0x158,
                                "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                               );
                }
              }
              else {
                this_01 = (cmRealDirectoryWatcher *)operator_new(0x70);
                p_00 = (cmVirtualDirectoryWatcher *)
                       __dynamic_cast(pcVar6,&cmVirtualDirectoryWatcher::typeinfo,
                                      &cmRealDirectoryWatcher::typeinfo,0);
                cmRealDirectoryWatcher::cmRealDirectoryWatcher(this_01,p_00,__k);
                (this_01->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher
                     = (_func_int **)&PTR__cmRealDirectoryWatcher_00605a88;
                iVar3 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&this_00->_M_h,__k);
                if (iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  pcVar5 = (cmRealDirectoryWatcher *)0x0;
                }
                else {
                  pcVar5 = *(cmRealDirectoryWatcher **)
                            ((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                                   ._M_cur + 0x28);
                }
                if (pcVar5 != this_01) {
                  __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                                ,0x15d,
                                "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                               );
                }
              }
            }
            else if (bVar9 && !bVar1) {
              lVar4 = __dynamic_cast(this_01,&cmIBaseWatcher::typeinfo,&cmFileWatcher::typeinfo,0);
              if (lVar4 == 0) {
                __assert_fail("filePtr",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                              ,0x162,
                              "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                             );
              }
              std::
              vector<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>_>
              ::push_back((vector<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>_>
                           *)(lVar4 + 0x30),cb);
              goto LAB_003ab459;
            }
            pcVar6 = (cmRootWatcher *)
                     __dynamic_cast(this_01,&cmIBaseWatcher::typeinfo,
                                    &cmVirtualDirectoryWatcher::typeinfo,0);
          }
LAB_003ab459:
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x20;
        } while (uVar2 != uVar8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      p_01 = local_60 + 1;
    } while (p_01 != local_68);
  }
  (*(this->Root->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher[5])();
  return;
}

Assistant:

void cmFileMonitor::MonitorPaths(const std::vector<std::string>& paths,
                                 Callback const& cb)
{
  for (std::string const& p : paths) {
    std::vector<std::string> pathSegments;
    cmsys::SystemTools::SplitPath(p, pathSegments, true);
    const bool pathIsFile = !cmsys::SystemTools::FileIsDirectory(p);

    const size_t segmentCount = pathSegments.size();
    if (segmentCount < 2) { // Expect at least rootdir and filename
      continue;
    }
    cmVirtualDirectoryWatcher* currentWatcher = this->Root;
    for (size_t i = 0; i < segmentCount; ++i) {
      assert(currentWatcher);

      const bool fileSegment = (i == segmentCount - 1 && pathIsFile);
      const bool rootSegment = (i == 0);
      assert(
        !(fileSegment &&
          rootSegment)); // Can not be both filename and root part of the path!

      const std::string& currentSegment = pathSegments[i];
      if (currentSegment.empty()) {
        continue;
      }

      cmIBaseWatcher* nextWatcher = currentWatcher->Find(currentSegment);
      if (!nextWatcher) {
        if (rootSegment) { // Root part
          assert(currentWatcher == this->Root);
          nextWatcher = new cmRootDirectoryWatcher(this->Root, currentSegment);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        } else if (fileSegment) { // File part
          assert(currentWatcher != this->Root);
          nextWatcher = new cmFileWatcher(
            dynamic_cast<cmRealDirectoryWatcher*>(currentWatcher),
            currentSegment, cb);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        } else { // Any normal directory in between
          nextWatcher = new cmDirectoryWatcher(
            dynamic_cast<cmRealDirectoryWatcher*>(currentWatcher),
            currentSegment);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        }
      } else {
        if (fileSegment) {
          auto filePtr = dynamic_cast<cmFileWatcher*>(nextWatcher);
          assert(filePtr);
          filePtr->AppendCallback(cb);
          continue;
        }
      }
      currentWatcher = dynamic_cast<cmVirtualDirectoryWatcher*>(nextWatcher);
    }
  }
  this->Root->StartWatching();
}